

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_set_palette_to_rgb(png_structrp png_ptr)

{
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) != 0) {
      png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
      return;
    }
    png_ptr->flags = png_ptr->flags | 0x4000;
    png_ptr->transformations = png_ptr->transformations | 0x2001000;
  }
  return;
}

Assistant:

static int
png_rtran_ok(png_structrp png_ptr, int need_IHDR)
{
   if (png_ptr != NULL)
   {
      if ((png_ptr->flags & PNG_FLAG_ROW_INIT) != 0)
         png_app_error(png_ptr,
             "invalid after png_start_read_image or png_read_update_info");

      else if (need_IHDR && (png_ptr->mode & PNG_HAVE_IHDR) == 0)
         png_app_error(png_ptr, "invalid before the PNG header has been read");

      else
      {
         /* Turn on failure to initialize correctly for all transforms. */
         png_ptr->flags |= PNG_FLAG_DETECT_UNINITIALIZED;

         return 1; /* Ok */
      }
   }

   return 0; /* no png_error possible! */
}